

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int count_square(MATRIX *matrix,int n,int i,int j)

{
  int iVar1;
  long lVar2;
  int l;
  long lVar3;
  
  iVar1 = 0;
  for (lVar2 = (long)-(i % 3) + (long)i; lVar2 < (i - i % 3) + 3; lVar2 = lVar2 + 1) {
    for (lVar3 = (long)(j - j % 3); lVar3 < (j - j % 3) + 3; lVar3 = lVar3 + 1) {
      iVar1 = iVar1 + (uint)(*(int *)(*(long *)&(matrix->
                                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start[lVar2].
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data + lVar3 * 4) == n);
    }
  }
  return iVar1;
}

Assistant:

int count_square(MATRIX &matrix, int n, int i, int j){
    int n_rows=0;
    for(int k=i/3*3; k<(i/3*3)+3; k++){
        for (int l=j/3*3;l<(j/3*3)+3; l++){
            if (matrix[k][l]==n){
                n_rows++;
            }
        }
    }
    return n_rows;
}